

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_DeleteNodes(UA_Server *server,UA_Session *session,UA_DeleteNodesRequest *request,
                        UA_DeleteNodesResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  
  sVar5 = request->nodesToDeleteSize;
  if (sVar5 == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)malloc(sVar5 * 4);
    response->results = pUVar2;
    if (pUVar2 != (UA_StatusCode *)0x0) {
      response->resultsSize = sVar5;
      lVar4 = 0;
      for (uVar3 = 0; uVar3 < sVar5; uVar3 = uVar3 + 1) {
        UVar1 = deleteNode(server,session,
                           (UA_NodeId *)
                           ((long)&(request->nodesToDelete->nodeId).namespaceIndex + lVar4),
                           (&request->nodesToDelete->deleteTargetReferences)[lVar4]);
        response->results[uVar3] = UVar1;
        sVar5 = request->nodesToDeleteSize;
        lVar4 = lVar4 + 0x20;
      }
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_DeleteNodes(UA_Server *server, UA_Session *session,
                         const UA_DeleteNodesRequest *request,
                         UA_DeleteNodesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteNodesRequest");
    if(request->nodesToDeleteSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->nodesToDeleteSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;;
        return;
    }
    response->resultsSize = request->nodesToDeleteSize;

    for(size_t i = 0; i < request->nodesToDeleteSize; ++i) {
        UA_DeleteNodesItem *item = &request->nodesToDelete[i];
        response->results[i] = deleteNode(server, session, &item->nodeId,
                                          item->deleteTargetReferences);
    }
}